

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O0

void av1_highbd_convolve_2d_sr_intrabc_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  uint16_t uVar1;
  int val;
  byte bVar2;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int32_t res;
  int32_t sum_1;
  int x_1;
  int y_1;
  int offset_bits;
  int16_t *src_vert;
  int32_t sum;
  int x;
  int y;
  int16_t *im;
  int im_stride;
  int im_h;
  int16_t im_block [17792];
  int bits;
  int local_8b5c;
  int local_8b58;
  undefined1 *local_8b50;
  int local_8b40;
  int local_8b3c;
  undefined1 *local_8b38;
  undefined1 local_8b28 [35584];
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  long local_18;
  long local_8;
  
  local_28 = (0xe - *(int *)(_x + 0x14)) - *(int *)(_x + 0x18);
  local_8b38 = local_8b28;
  local_8 = in_RDI;
  for (local_8b3c = 0; local_8b3c < in_R9D + 1; local_8b3c = local_8b3c + 1) {
    for (local_8b40 = 0; local_8b40 < in_R8D; local_8b40 = local_8b40 + 1) {
      *(short *)(local_8b38 + (long)local_8b40 * 2) =
           (short)((int)((1 << ((char)im + 6U & 0x1f)) +
                         ((uint)*(ushort *)(local_8 + (long)local_8b40 * 2) +
                         (uint)*(ushort *)(local_8 + (long)(local_8b40 + 1) * 2)) * 0x40 +
                        ((1 << ((byte)*(undefined4 *)(_x + 0x14) & 0x1f)) >> 1)) >>
                  ((byte)*(undefined4 *)(_x + 0x14) & 0x1f));
    }
    local_8 = local_8 + (long)in_ESI * 2;
    local_8b38 = local_8b38 + (long)in_R8D * 2;
  }
  local_8b50 = local_8b28;
  bVar2 = ((char)im + '\x0e') - (char)*(undefined4 *)(_x + 0x14);
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  for (local_8b58 = 0; local_8b58 < local_24; local_8b58 = local_8b58 + 1) {
    for (local_8b5c = 0; local_8b5c < local_20; local_8b5c = local_8b5c + 1) {
      val = (1 << (bVar2 & 0x1f)) +
            ((int)*(short *)(local_8b50 + (long)local_8b5c * 2) +
            (int)*(short *)(local_8b50 + (long)(in_R8D + local_8b5c) * 2)) * 0x40;
      uVar1 = clip_pixel_highbd(val,(val + ((1 << ((byte)*(undefined4 *)(_x + 0x18) & 0x1f)) >> 1)
                                    >> ((byte)*(undefined4 *)(_x + 0x18) & 0x1f)) -
                                    ((1 << (bVar2 - (char)*(undefined4 *)(_x + 0x18) & 0x1f)) +
                                    (1 << ((bVar2 - (char)*(undefined4 *)(_x + 0x18)) - 1 & 0x1f))))
      ;
      *(uint16_t *)(local_18 + (long)local_8b5c * 2) = uVar1;
    }
    local_8b50 = local_8b50 + (long)in_R8D * 2;
    local_18 = local_18 + (long)local_1c * 2;
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_sr_intrabc_c(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  assert(bits >= 0);
  assert(subpel_x_qn == 8);
  assert(subpel_y_qn == 8);
  assert(filter_params_x->taps == 2 && filter_params_y->taps == 2);
  assert((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS);
  (void)filter_params_x;
  (void)subpel_x_qn;
  (void)filter_params_y;
  (void)subpel_y_qn;
  (void)conv_params;

  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + 1;
  int im_stride = w;
  assert(w <= MAX_SB_SIZE && h <= MAX_SB_SIZE);

  // horizontal filter
  // explicitly operate for subpel_x_qn = 8.
  int16_t *im = im_block;
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1)) + 64 * (src[x] + src[x + 1]);
      assert(0 <= sum && sum < (1 << (bd + FILTER_BITS + 1)));
      sum = ROUND_POWER_OF_TWO(sum, conv_params->round_0);
      im[x] = sum;
    }
    src += src_stride;
    im += im_stride;
  }

  // vertical filter
  // explicitly operate for subpel_y_qn = 8.
  int16_t *src_vert = im_block;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t sum =
          (1 << offset_bits) + 64 * (src_vert[x] + src_vert[im_stride + x]);
      assert(0 <= sum && sum < (1 << (offset_bits + 2)));
      const int32_t res = ROUND_POWER_OF_TWO(sum, conv_params->round_1) -
                          ((1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1)));

      dst[x] = clip_pixel_highbd(ROUND_POWER_OF_TWO(res, bits), bd);
    }
    src_vert += im_stride;
    dst += dst_stride;
  }
}